

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

word Dau_Dsd6ToTruth(char *p)

{
  word wStack_20;
  char *p_local;
  
  if (*p == '1') {
    if (p[1] == '\0') {
      wStack_20 = 0xffffffffffffffff;
      goto LAB_003efc74;
    }
  }
  else if ((*p == '0') && (p[1] == '\0')) {
    wStack_20 = 0;
    goto LAB_003efc74;
  }
  p_local = p;
  Dau_DsdComputeMatches(p);
  wStack_20 = Dau_Dsd6ToTruth_rec(p,&p_local,Dau_DsdComputeMatches::pMatches,s_Truths6);
  p = p_local;
LAB_003efc74:
  p_local = p + 1;
  if (p[1] == '\0') {
    return wStack_20;
  }
  __assert_fail("*++p == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                ,0x1c6,"word Dau_Dsd6ToTruth(char *)");
}

Assistant:

word Dau_Dsd6ToTruth( char * p )
{
    word Res;
    if ( *p == '0' && *(p+1) == 0 )
        Res = 0;
    else if ( *p == '1' && *(p+1) == 0 )
        Res = ~(word)0;
    else
        Res = Dau_Dsd6ToTruth_rec( p, &p, Dau_DsdComputeMatches(p), s_Truths6 );
    assert( *++p == 0 );
    return Res;
}